

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeEnsemble.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::TreeEnsembleClassifier::TreeEnsembleClassifier
          (TreeEnsembleClassifier *this,TreeEnsembleClassifier *from)

{
  bool bVar1;
  ClassLabelsCase CVar2;
  TreeEnsembleParameters *this_00;
  StringVector *this_01;
  StringVector *from_00;
  Int64Vector *this_02;
  Int64Vector *from_01;
  TreeEnsembleClassifier *from_local;
  TreeEnsembleClassifier *this_local;
  
  google::protobuf::MessageLite::MessageLite(&this->super_MessageLite);
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__TreeEnsembleClassifier_006faa60;
  ClassLabelsUnion::ClassLabelsUnion((ClassLabelsUnion *)&this->ClassLabels_);
  google::protobuf::internal::CachedSize::CachedSize(&this->_cached_size_);
  google::protobuf::internal::InternalMetadata::MergeFrom<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_,
             &(from->super_MessageLite)._internal_metadata_);
  bVar1 = _internal_has_treeensemble(from);
  if (bVar1) {
    this_00 = (TreeEnsembleParameters *)operator_new(0x48);
    TreeEnsembleParameters::TreeEnsembleParameters(this_00,from->treeensemble_);
    this->treeensemble_ = this_00;
  }
  else {
    this->treeensemble_ = (TreeEnsembleParameters *)0x0;
  }
  this->postevaluationtransform_ = from->postevaluationtransform_;
  clear_has_ClassLabels(this);
  CVar2 = ClassLabels_case(from);
  if (CVar2 != CLASSLABELS_NOT_SET) {
    if (CVar2 == kStringClassLabels) {
      this_01 = _internal_mutable_stringclasslabels(this);
      from_00 = _internal_stringclasslabels(from);
      StringVector::MergeFrom(this_01,from_00);
    }
    else if (CVar2 == kInt64ClassLabels) {
      this_02 = _internal_mutable_int64classlabels(this);
      from_01 = _internal_int64classlabels(from);
      Int64Vector::MergeFrom(this_02,from_01);
    }
  }
  return;
}

Assistant:

TreeEnsembleClassifier::TreeEnsembleClassifier(const TreeEnsembleClassifier& from)
  : ::PROTOBUF_NAMESPACE_ID::MessageLite() {
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
  if (from._internal_has_treeensemble()) {
    treeensemble_ = new ::CoreML::Specification::TreeEnsembleParameters(*from.treeensemble_);
  } else {
    treeensemble_ = nullptr;
  }
  postevaluationtransform_ = from.postevaluationtransform_;
  clear_has_ClassLabels();
  switch (from.ClassLabels_case()) {
    case kStringClassLabels: {
      _internal_mutable_stringclasslabels()->::CoreML::Specification::StringVector::MergeFrom(from._internal_stringclasslabels());
      break;
    }
    case kInt64ClassLabels: {
      _internal_mutable_int64classlabels()->::CoreML::Specification::Int64Vector::MergeFrom(from._internal_int64classlabels());
      break;
    }
    case CLASSLABELS_NOT_SET: {
      break;
    }
  }
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.TreeEnsembleClassifier)
}